

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfuturewatcher.cpp
# Opt level: O1

void QFutureWatcherBase::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  int iVar2;
  offset_in_QFutureWatcherBase_to_subr *candidate;
  QFutureInterfaceBase *this;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 uVar3;
  void **argv;
  undefined1 suspend;
  long in_FS_OFFSET;
  undefined4 local_3c;
  void *local_38;
  undefined4 *puStack_30;
  long local_20;
  undefined4 extraout_var;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if (((((((code *)*plVar1 == started) && (uVar3 = 0, plVar1[1] == 0)) ||
          (((code *)*plVar1 == finished && (uVar3 = 1, plVar1[1] == 0)))) ||
         (((code *)*plVar1 == canceled && (uVar3 = 2, plVar1[1] == 0)))) ||
        (((((code *)*plVar1 == paused && (uVar3 = 3, plVar1[1] == 0)) ||
          ((((code *)*plVar1 == suspending && (uVar3 = 4, plVar1[1] == 0)) ||
           (((code *)*plVar1 == suspended && (uVar3 = 5, plVar1[1] == 0)))))) ||
         ((((code *)*plVar1 == resumed && (uVar3 = 6, plVar1[1] == 0)) ||
          (((code *)*plVar1 == resultReadyAt && (uVar3 = 7, plVar1[1] == 0)))))))) ||
       (((((code *)*plVar1 == resultsReadyAt && (uVar3 = 8, plVar1[1] == 0)) ||
         (((code *)*plVar1 == progressRangeChanged && (uVar3 = 9, plVar1[1] == 0)))) ||
        ((((code *)*plVar1 == progressValueChanged && (uVar3 = 10, plVar1[1] == 0)) ||
         (((code *)*plVar1 == progressTextChanged && (uVar3 = 0xb, plVar1[1] == 0)))))))) {
      *(undefined4 *)*_a = uVar3;
    }
    goto LAB_003dd6b1;
  }
  if (_c != InvokeMetaMethod) goto LAB_003dd6b1;
  switch(_id) {
  case 0:
    iVar2 = 0;
    break;
  case 1:
    iVar2 = 1;
    break;
  case 2:
    iVar2 = 2;
    break;
  case 3:
    iVar2 = 3;
    break;
  case 4:
    iVar2 = 4;
    break;
  case 5:
    iVar2 = 5;
    break;
  case 6:
    iVar2 = 6;
    break;
  case 7:
    local_3c = *_a[1];
    puStack_30 = &local_3c;
    argv = &local_38;
    local_38 = (void *)0x0;
    iVar2 = 7;
    goto LAB_003dd565;
  case 8:
    resultsReadyAt((QFutureWatcherBase *)_o,*_a[1],*_a[2]);
    goto LAB_003dd6b1;
  case 9:
    progressRangeChanged((QFutureWatcherBase *)_o,*_a[1],*_a[2]);
    goto LAB_003dd6b1;
  case 10:
    local_3c = *_a[1];
    puStack_30 = &local_3c;
    argv = &local_38;
    local_38 = (void *)0x0;
    iVar2 = 10;
    goto LAB_003dd565;
  case 0xb:
    puStack_30 = (undefined4 *)_a[1];
    argv = &local_38;
    local_38 = (void *)0x0;
    iVar2 = 0xb;
    goto LAB_003dd565;
  case 0xc:
    iVar2 = (*_o->_vptr_QObject[0xd])();
    QFutureInterfaceBase::cancel((QFutureInterfaceBase *)CONCAT44(extraout_var_02,iVar2));
    goto LAB_003dd6b1;
  case 0xd:
  case 0x11:
    suspend = *_a[1];
    iVar2 = (*_o->_vptr_QObject[0xd])();
    this = (QFutureInterfaceBase *)CONCAT44(extraout_var,iVar2);
    goto LAB_003dd550;
  case 0xe:
  case 0x12:
    iVar2 = (*_o->_vptr_QObject[0xd])();
    this = (QFutureInterfaceBase *)CONCAT44(extraout_var_01,iVar2);
    suspend = true;
    goto LAB_003dd550;
  case 0xf:
    iVar2 = (*_o->_vptr_QObject[0xd])();
    this = (QFutureInterfaceBase *)CONCAT44(extraout_var_03,iVar2);
    suspend = false;
LAB_003dd550:
    QFutureInterfaceBase::setSuspended(this,(bool)suspend);
    goto LAB_003dd6b1;
  case 0x10:
  case 0x13:
    iVar2 = (*_o->_vptr_QObject[0xd])();
    QFutureInterfaceBase::toggleSuspended((QFutureInterfaceBase *)CONCAT44(extraout_var_00,iVar2));
  default:
    goto LAB_003dd6b1;
  }
  argv = (void **)0x0;
LAB_003dd565:
  QMetaObject::activate(_o,&staticMetaObject,iVar2,argv);
LAB_003dd6b1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureWatcherBase::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFutureWatcherBase *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->started(); break;
        case 1: _t->finished(); break;
        case 2: _t->canceled(); break;
        case 3: _t->paused(); break;
        case 4: _t->suspending(); break;
        case 5: _t->suspended(); break;
        case 6: _t->resumed(); break;
        case 7: _t->resultReadyAt((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 8: _t->resultsReadyAt((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 9: _t->progressRangeChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 10: _t->progressValueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 11: _t->progressTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 12: _t->cancel(); break;
        case 13: _t->setSuspended((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 14: _t->suspend(); break;
        case 15: _t->resume(); break;
        case 16: _t->toggleSuspended(); break;
        case 17: _t->setPaused((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 18: _t->pause(); break;
        case 19: _t->togglePaused(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::started, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::finished, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::canceled, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::paused, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::suspending, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::suspended, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::resumed, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(int )>(_a, &QFutureWatcherBase::resultReadyAt, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(int , int )>(_a, &QFutureWatcherBase::resultsReadyAt, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(int , int )>(_a, &QFutureWatcherBase::progressRangeChanged, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(int )>(_a, &QFutureWatcherBase::progressValueChanged, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(const QString & )>(_a, &QFutureWatcherBase::progressTextChanged, 11))
            return;
    }
}